

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

SchnorrPubkey *
cfd::core::SchnorrPubkey::FromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *pCVar2;
  int pk_parity;
  secp256k1_xonly_pubkey x_only_pubkey;
  secp256k1_keypair keypair;
  int local_ec;
  ByteData local_e8;
  undefined1 local_d0 [64];
  secp256k1_keypair local_90;
  
  ctx = wally_get_secp_context();
  Privkey::GetData(&local_e8,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,&local_e8);
  iVar1 = secp256k1_keypair_create(ctx,&local_90,(uchar *)local_d0._0_8_);
  if ((uchar *)local_d0._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ - local_d0._0_8_);
  }
  if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (iVar1 == 1) {
    local_ec = 0;
    iVar1 = secp256k1_keypair_xonly_pub(ctx,(secp256k1_xonly_pubkey *)local_d0,&local_ec,&local_90);
    if (iVar1 == 1) {
      if (parity != (bool *)0x0) {
        *parity = local_ec != 0;
      }
      ConvertSchnorrPubkey((ByteData256 *)&local_e8,(secp256k1_xonly_pubkey *)local_d0);
      SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)&local_e8);
      if (local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    CfdException::CfdException(pCVar2,kCfdInternalError);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_d0._0_8_ = local_d0 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"Invalid private key","");
  CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_d0);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey SchnorrPubkey::FromPrivkey(
    const Privkey &privkey, bool *parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);

  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}